

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
write_bigint_value(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                   *this,string_view_type *sv)

{
  bignum_format_kind bVar1;
  bool bVar2;
  basic_bigint<std::allocator<unsigned_char>_> *x;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v_1;
  int signum_1;
  bool is_neg_1;
  bigint n_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  int signum;
  bool is_neg;
  bigint n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe28;
  stream_sink<char> *in_stack_fffffffffffffe30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe38;
  char cVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe40;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  char *in_stack_fffffffffffffe48;
  stream_sink<char> *in_stack_fffffffffffffe50;
  int64_t in_stack_fffffffffffffe58;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe80;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffe88;
  stream_sink<char> local_168 [2];
  byte local_f1;
  uchar *local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  
  bVar1 = basic_json_encode_options<char>::bignum_format
                    ((basic_json_encode_options<char> *)(in_RDI + 0x40));
  if (bVar1 == number) {
    std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
    stream_sink<char>::append
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (size_t)in_stack_fffffffffffffe40._M_current);
  }
  else if (bVar1 == base64) {
    x = (basic_bigint<std::allocator<unsigned_char>_> *)
        std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    bVar2 = jsoncons::operator<(x,in_stack_fffffffffffffe58);
    if (bVar2) {
      basic_bigint<std::allocator<unsigned_char>_>::operator-
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe38._M_current);
      jsoncons::operator-(in_stack_fffffffffffffe88,CONCAT17(bVar1,in_stack_fffffffffffffe80));
      basic_bigint<std::allocator<unsigned_char>_>::operator=
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe40._M_current,
                 (basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe38._M_current);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x21bc5e);
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    stream_sink<char>::push_back
              ((stream_sink<char> *)in_stack_fffffffffffffe40._M_current,
               (char)((ulong)in_stack_fffffffffffffe38._M_current >> 0x38));
    if (bVar2) {
      stream_sink<char>::push_back
                ((stream_sink<char> *)in_stack_fffffffffffffe40._M_current,
                 (char)((ulong)in_stack_fffffffffffffe38._M_current >> 0x38));
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffe28);
    local_c8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  (in_stack_fffffffffffffe28);
    encode_base64<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::stream_sink<char>>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    stream_sink<char>::push_back
              ((stream_sink<char> *)in_stack_fffffffffffffe40._M_current,
               (char)((ulong)in_stack_fffffffffffffe38._M_current >> 0x38));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe40._M_current);
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
              ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
  }
  else if (bVar1 == base64url) {
    std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_f1 = jsoncons::operator<(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if ((bool)local_f1) {
      basic_bigint<std::allocator<unsigned_char>_>::operator-
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe38._M_current);
      jsoncons::operator-(in_stack_fffffffffffffe88,CONCAT17(bVar1,in_stack_fffffffffffffe80));
      basic_bigint<std::allocator<unsigned_char>_>::operator=
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe40._M_current,
                 (basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe38._M_current);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    }
    cVar3 = (char)((ulong)in_stack_fffffffffffffe38._M_current >> 0x38);
    first._M_current = (uchar *)local_168;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x21be9b);
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    stream_sink<char>::push_back((stream_sink<char> *)first._M_current,cVar3);
    if ((local_f1 & 1) != 0) {
      stream_sink<char>::push_back((stream_sink<char> *)first._M_current,cVar3);
    }
    last._M_current = (uchar *)local_168;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffe28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffe28);
    encode_base64url<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::stream_sink<char>>
              (first,last,in_stack_fffffffffffffe30);
    stream_sink<char>::push_back
              ((stream_sink<char> *)first._M_current,(char)((ulong)last._M_current >> 0x38));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)first._M_current);
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
              ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
  }
  else {
    stream_sink<char>::push_back
              ((stream_sink<char> *)in_stack_fffffffffffffe40._M_current,
               (char)((ulong)in_stack_fffffffffffffe38._M_current >> 0x38));
    cVar3 = (char)((ulong)in_stack_fffffffffffffe38._M_current >> 0x38);
    std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
    stream_sink<char>::append
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (size_t)in_stack_fffffffffffffe40._M_current);
    stream_sink<char>::push_back((stream_sink<char> *)in_stack_fffffffffffffe40._M_current,cVar3);
  }
  return;
}

Assistant:

void write_bigint_value(const string_view_type& sv)
        {
            switch (options_.bignum_format())
            {
                case bignum_format_kind::raw:
                {
                    sink_.append(sv.data(),sv.size());
                    break;
                }
                case bignum_format_kind::base64:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                    }
                    encode_base64(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    break;
                }
                case bignum_format_kind::base64url:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                    }
                    encode_base64url(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    break;
                }
                default:
                {
                    sink_.push_back('\"');
                    sink_.append(sv.data(),sv.size());
                    sink_.push_back('\"');
                    break;
                }
            }
        }